

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendmsg2.c
# Opt level: O0

objc_slot2 * objc_get_slot2(Class cls,SEL selector,uint64_t *version)

{
  uint32_t index;
  IMP p_Var1;
  undefined8 *puVar2;
  SparseArray *local_30;
  void *dtable;
  objc_slot2 *result;
  uint64_t *version_local;
  SEL selector_local;
  Class cls_local;
  
  if (version != (uint64_t *)0x0) {
    *version = objc_method_cache_version;
  }
  dtable = SparseArrayLookup((SparseArray *)cls->dtable,(uint32_t)(selector->field_0).index);
  if (dtable == (void *)0x0) {
    local_30 = dtable_for_class(cls);
    if (local_30 == uninstalled_dtable) {
      local_30 = dtable_for_class(cls);
      dtable = SparseArrayLookup(local_30,(uint32_t)(selector->field_0).index);
    }
    else {
      dtable = SparseArrayLookup(local_30,(uint32_t)(selector->field_0).index);
    }
    if (dtable == (void *)0x0) {
      index = get_untyped_idx(selector);
      dtable = SparseArrayLookup(local_30,index);
      if ((objc_slot2 *)dtable != (objc_slot2 *)0x0) {
        if (version != (uint64_t *)0x0) {
          *version = 0;
        }
        p_Var1 = call_mismatch_hook(cls,selector,(objc_slot2 *)dtable);
        puVar2 = (undefined8 *)__tls_get_addr(&PTR_0014af58);
        *puVar2 = p_Var1;
        dtable = (void *)__tls_get_addr(&PTR_0014af58);
      }
    }
  }
  return (objc_slot2 *)dtable;
}

Assistant:

struct objc_slot2 *objc_get_slot2(Class cls, SEL selector, uint64_t *version)
{
#ifndef NO_SAFE_CACHING
	if (version)
	{
		*version = objc_method_cache_version;
	}
#endif
	struct objc_slot2 * result = objc_dtable_lookup(cls->dtable, selector->index);
	if (0 == result)
	{
		void *dtable = dtable_for_class(cls);
		/* Install the dtable if it hasn't already been initialized. */
		if (dtable == uninstalled_dtable)
		{
			dtable = dtable_for_class(cls);
			result = objc_dtable_lookup(dtable, selector->index);
		}
		else
		{
			// Check again incase another thread updated the dtable while we
			// weren't looking
			result = objc_dtable_lookup(dtable, selector->index);
		}
		if (NULL == result)
		{
			if ((result = objc_dtable_lookup(dtable, get_untyped_idx(selector))))
			{
#ifndef NO_SAFE_CACHING
				if (version)
				{
					*version = 0;
				}
#endif
				uncacheable_slot.imp = call_mismatch_hook(cls, selector, result);
				result = (struct objc_slot2*)&uncacheable_slot;
			}
		}
	}
	return result;
}